

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym2612.c
# Opt level: O0

int SLOT_SET(ym2612_ *YM2612,int Adr,uchar data)

{
  slot__ *psVar1;
  uint uVar2;
  long lVar3;
  uint local_34;
  int nsl;
  int nch;
  slot_ *SL;
  channel_ *CH;
  uchar data_local;
  int Adr_local;
  ym2612_ *YM2612_local;
  
  local_34 = Adr & 3;
  if (local_34 == 3) {
    YM2612_local._4_4_ = 1;
  }
  else {
    if ((Adr & 0x100U) != 0) {
      local_34 = local_34 + 3;
    }
    lVar3 = (long)(int)local_34;
    psVar1 = YM2612->CHANNEL[lVar3].SLOT + (int)(Adr >> 2 & 3);
    uVar2 = Adr & 0xf0;
    if (uVar2 == 0x30) {
      psVar1->MUL = data & 0xf;
      if ((data & 0xf) == 0) {
        psVar1->MUL = 1;
      }
      else {
        psVar1->MUL = psVar1->MUL << 1;
      }
      psVar1->DT = YM2612->DT_TAB[(int)((int)(uint)data >> 4 & 7)];
      YM2612->CHANNEL[lVar3].SLOT[0].Finc = -1;
    }
    else if (uVar2 == 0x40) {
      psVar1->TL = data & 0x7f;
      YM2612_Special_Update(YM2612);
      psVar1->TLL = psVar1->TL << 5;
    }
    else if (uVar2 == 0x50) {
      psVar1->KSR_S = 3 - ((int)(uint)data >> 6);
      YM2612->CHANNEL[lVar3].SLOT[0].Finc = -1;
      if ((data & 0x1f) == 0) {
        psVar1->AR = (int *)NULL_RATE;
      }
      else {
        psVar1->AR = (int *)(YM2612->AR_TAB + (int)((uint)(data & 0x1f) << 1));
      }
      psVar1->EincA = psVar1->AR[psVar1->KSR];
      if (psVar1->Ecurp == 0) {
        psVar1->Einc = psVar1->EincA;
      }
    }
    else if (uVar2 == 0x60) {
      psVar1->AMSon = data & 0x80;
      if ((data & 0x80) == 0) {
        psVar1->AMS = 0x1f;
      }
      else {
        psVar1->AMS = YM2612->CHANNEL[lVar3].AMS;
      }
      if ((data & 0x1f) == 0) {
        psVar1->DR = (int *)NULL_RATE;
      }
      else {
        psVar1->DR = (int *)(YM2612->DR_TAB + (int)((uint)(data & 0x1f) << 1));
      }
      psVar1->EincD = psVar1->DR[psVar1->KSR];
      if (psVar1->Ecurp == 1) {
        psVar1->Einc = psVar1->EincD;
      }
    }
    else if (uVar2 == 0x70) {
      if ((data & 0x1f) == 0) {
        psVar1->SR = (int *)NULL_RATE;
      }
      else {
        psVar1->SR = (int *)(YM2612->DR_TAB + (int)((uint)(data & 0x1f) << 1));
      }
      psVar1->EincS = psVar1->SR[psVar1->KSR];
      if ((psVar1->Ecurp == 2) && (psVar1->Ecnt < 0x20000000)) {
        psVar1->Einc = psVar1->EincS;
      }
    }
    else if (uVar2 == 0x80) {
      psVar1->SLL = SL_TAB[(int)(uint)data >> 4];
      psVar1->RR = (int *)(YM2612->DR_TAB + (int)((data & 0xf) * 4 + 2));
      psVar1->EincR = psVar1->RR[psVar1->KSR];
      if ((psVar1->Ecurp == 3) && (psVar1->Ecnt < 0x20000000)) {
        psVar1->Einc = psVar1->EincR;
      }
    }
    else if (uVar2 == 0x90) {
      CH._3_1_ = data;
      if (YM2612->Enable_SSGEG != '\0') {
        CH._3_1_ = 0;
      }
      if ((CH._3_1_ & 8) == 0) {
        psVar1->SEG = 0;
      }
      else {
        psVar1->SEG = CH._3_1_ & 0xf;
      }
    }
    YM2612_local._4_4_ = 0;
  }
  return YM2612_local._4_4_;
}

Assistant:

int SLOT_SET(ym2612_ *YM2612, int Adr, unsigned char data)
{
  channel_ *CH;
  slot_ *SL;
  int nch, nsl;

  if ((nch = Adr & 3) == 3)
    return 1;
  nsl = (Adr >> 2) & 3;

  if (Adr & 0x100)
   nch += 3;

  CH = &(YM2612->CHANNEL[nch]);
  SL = &(CH->SLOT[nsl]);

  switch (Adr & 0xF0)
  {
    case 0x30:
      if ((SL->MUL = (data & 0x0F)))
        SL->MUL <<= 1;
      else
        SL->MUL = 1;

      SL->DT = YM2612->DT_TAB[(data >> 4) & 7];

      CH->SLOT[0].Finc = -1;

#if YM_DEBUG_LEVEL > 1
      fprintf(debug_file, "CHANNEL[%d], SLOT[%d] DTMUL = %.2X\n", nch, nsl, data & 0x7F);
#endif
      break;

    case 0x40:
      SL->TL = data & 0x7F;

      // SOR2 do a lot of TL adjustement and this fix R.Shinobi jump sound...
      YM2612_Special_Update(YM2612);

#if ((ENV_HBITS - 7) < 0)
      SL->TLL = SL->TL >> (7 - ENV_HBITS);
#else
      SL->TLL = SL->TL << (ENV_HBITS - 7);
#endif

#if YM_DEBUG_LEVEL > 1
      fprintf(debug_file, "CHANNEL[%d], SLOT[%d] TL = %.2X\n", nch, nsl, SL->TL);
#endif
      break;

    case 0x50:
      SL->KSR_S = 3 - (data >> 6);

      CH->SLOT[0].Finc = -1;

      if (data &= 0x1F)
        SL->AR = &YM2612->AR_TAB[data << 1];
      else
        SL->AR = &NULL_RATE[0];

      SL->EincA = SL->AR[SL->KSR];
      if (SL->Ecurp == ATTACK)
        SL->Einc = SL->EincA;

#if YM_DEBUG_LEVEL > 1
      fprintf(debug_file, "CHANNEL[%d], SLOT[%d] AR = %.2X  EincA = %.6X\n", nch, nsl, data, SL->EincA);
#endif
      break;

    case 0x60:
      if ((SL->AMSon = (data & 0x80)))
        SL->AMS = CH->AMS;
      else
      SL->AMS = 31;

      if (data &= 0x1F)
        SL->DR = &YM2612->DR_TAB[data << 1];
      else
        SL->DR = &NULL_RATE[0];

      SL->EincD = SL->DR[SL->KSR];
      if (SL->Ecurp == DECAY)
        SL->Einc = SL->EincD;

#if YM_DEBUG_LEVEL > 1
      fprintf(debug_file, "CHANNEL[%d], SLOT[%d] AMS = %d  DR = %.2X  EincD = %.6X\n", nch, nsl, SL->AMSon, data, SL->EincD);
#endif
      break;

    case 0x70:
      if (data &= 0x1F)
        SL->SR = &YM2612->DR_TAB[data << 1];
      else
        SL->SR = &NULL_RATE[0];

      SL->EincS = SL->SR[SL->KSR];
      if ((SL->Ecurp == SUBSTAIN) && (SL->Ecnt < ENV_END))
        SL->Einc = SL->EincS;

#if YM_DEBUG_LEVEL > 1
      fprintf(debug_file, "CHANNEL[%d], SLOT[%d] SR = %.2X  EincS = %.6X\n", nch, nsl, data, SL->EincS);
#endif
      break;

    case 0x80:
      SL->SLL = SL_TAB[data >> 4];

      SL->RR = &YM2612->DR_TAB[((data & 0xF) << 2) + 2];

      SL->EincR = SL->RR[SL->KSR];
      if ((SL->Ecurp == RELEASE) && (SL->Ecnt < ENV_END))
        SL->Einc = SL->EincR;

#if YM_DEBUG_LEVEL > 1
      fprintf(debug_file, "CHANNEL[%d], SLOT[%d] SL = %.8X\n", nch, nsl, SL->SLL);
      fprintf(debug_file, "CHANNEL[%d], SLOT[%d] RR = %.2X  EincR = %.2X\n", nch, nsl, ((data & 0xF) << 1) | 2, SL->EincR);
#endif
      break;

    case 0x90:
      // SSG-EG envelope shapes :
      /*
         E  At Al H
        
         1  0  0  0  \\\\
        
         1  0  0  1  \___
        
         1  0  1  0  \/\/
                      ___
         1  0  1  1  \
        
         1  1  0  0  ////
                      ___
         1  1  0  1  /
        
         1  1  1  0  /\/\
        
         1  1  1  1  /___
        
         E  = SSG-EG enable
         At = Start negate
         Al = Altern
         H  = Hold */

      if (YM2612->Enable_SSGEG)
        data = 0;
      if (data & 0x08)
        SL->SEG = data & 0x0F;
      else
        SL->SEG = 0;

#if YM_DEBUG_LEVEL > 1
      fprintf(debug_file, "CHANNEL[%d], SLOT[%d] SSG-EG = %.2X\n", nch, nsl, data);
#endif
      break;
  }

  return 0;
}